

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O3

double __thiscall
NoMeEdgeCalculator::scoreSequences
          (NoMeEdgeCalculator *this,string *code1,string *qual1,string *code2,string *qual2,
          int start1,int end1,int start2,int end2,bool isStrand1,bool isClique,int numGCAllowedPos,
          int ct)

{
  char cVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  uint __val;
  long lVar6;
  int *piVar7;
  hmm *phVar8;
  uint uVar9;
  int iVar10;
  string *psVar11;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  uint uVar14;
  char *__end;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
  _Var15;
  string *psVar16;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  int iVar17;
  int iVar18;
  string *psVar19;
  double dVar20;
  int rightNonOverlapGCCount;
  string prevCountQual;
  string compareString1;
  string compareString2;
  string compareQual1;
  string compareQual2;
  undefined1 local_210 [32];
  string *local_1f0;
  string *local_1e8;
  undefined1 local_1e0 [24];
  _Hash_node_base *p_Stack_1c8;
  float local_1c0;
  undefined4 uStack_1bc;
  size_t sStack_1b8;
  undefined1 auStack_1b0 [24];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
  local_198;
  __buckets_ptr local_190;
  undefined1 local_188 [24];
  string local_170;
  string local_150;
  undefined1 local_130 [32];
  string local_110;
  NoMeEdgeCalculator *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  lVar6 = std::__cxx11::string::find((char *)code1,0x19a4e0,0);
  if ((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)code1,0x19a4dd,0), lVar6 == -1))
  {
    return -1.0;
  }
  iVar10 = 0;
  auStack_1b0._8_8_ = code1;
  lVar6 = std::__cxx11::string::find((char *)code2,0x19a4e0,0);
  if ((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)code2,0x19a4dd,0), lVar6 == -1))
  {
    return -1.0;
  }
  iVar18 = start1 - start2;
  if (iVar18 == 0 || start1 < start2) {
    iVar18 = 0;
  }
  if (start1 < start2) {
    iVar18 = 0;
    iVar10 = -(start1 - start2);
  }
  if (end1 < end2) {
    if (start2 < start1) {
LAB_0015be1f:
      iVar17 = -start1;
    }
    else {
      if (start2 <= start1) {
        if (start1 != start2) {
LAB_0015c4fd:
          __val = 0;
          goto LAB_0015be64;
        }
        goto LAB_0015be1f;
      }
LAB_0015be47:
      iVar17 = -start2;
    }
    __val = end1 + iVar17 + 1;
LAB_0015be5b:
    if ((int)__val < 0) {
      return -1.0;
    }
  }
  else {
    if (end2 < end1) {
      if (start2 < start1) {
LAB_0015be29:
        __val = (end2 - start1) + 1;
      }
      else {
        if (start2 <= start1) {
          if (start1 != start2) goto LAB_0015c4fd;
          goto LAB_0015be29;
        }
        __val = end2 - start2;
      }
      goto LAB_0015be5b;
    }
    __val = 0;
    if (end1 == end2) {
      if (start1 < start2) goto LAB_0015be47;
      if ((start1 != start2 && start2 <= start1) || (start1 == start2)) goto LAB_0015be1f;
    }
  }
LAB_0015be64:
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_1f0 = code2;
  local_1e8 = qual1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_188 + 0x18),"","");
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  auStack_1b0._20_4_ = 0;
  if (iVar10 == iVar18) {
    std::__cxx11::string::_M_assign((string *)(local_188 + 0x18));
    std::__cxx11::string::_M_assign((string *)local_130);
    std::__cxx11::string::_M_assign((string *)&local_150);
    std::__cxx11::string::_M_assign((string *)&local_110);
  }
  else if (iVar18 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_150);
    std::__cxx11::string::_M_assign((string *)&local_110);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"0","");
    local_198._M_h = (__hashtable_alloc *)local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
    if (*(size_type *)(auStack_1b0._8_8_ + 8) != 0) {
      psVar11 = (string *)0x0;
      local_188._16_8_ = local_188._16_8_ & 0xffffffff00000000;
      psVar16 = (string *)auStack_1b0._8_8_;
      psVar19 = local_1e8;
      while (_Var15._M_h = local_198._M_h, uVar2 = local_1e0._0_8_,
            psVar11 < (string *)psVar19->_M_string_length) {
        cVar1 = (psVar16->_M_dataplus)._M_p[(long)&(psVar11->_M_dataplus)._M_p];
        local_1f0 = psVar11;
        if ((cVar1 == 'O') || (cVar1 == 'C')) {
          if (((__buckets_ptr)local_1e0._8_8_ != local_190) ||
             (((__buckets_ptr)local_1e0._8_8_ != (__buckets_ptr)0x0 &&
              (iVar18 = bcmp((void *)local_1e0._0_8_,local_198._M_h,local_1e0._8_8_), iVar18 != 0)))
             ) goto LAB_0015c50d;
          piVar7 = __errno_location();
          iVar18 = *piVar7;
          *piVar7 = 0;
          lVar6 = strtol((char *)uVar2,(char **)local_210,10);
          psVar16 = (string *)auStack_1b0._8_8_;
          psVar19 = local_1e8;
          if (local_210._0_8_ != uVar2) {
            if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) {
                *piVar7 = iVar18;
              }
              iVar18 = local_188._16_4_ + (int)lVar6;
              iVar17 = iVar18 - iVar10;
              if (iVar17 == 0) {
                std::__cxx11::string::substr((ulong)local_210,auStack_1b0._8_8_);
                psVar19 = local_1e8;
                std::__cxx11::string::_M_append(local_188 + 0x18,local_210._0_8_);
                if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                  operator_delete((void *)local_210._0_8_);
                }
                std::__cxx11::string::substr((ulong)local_210,(ulong)psVar19);
                std::__cxx11::string::_M_append(local_130,local_210._0_8_);
              }
              else {
                if (iVar17 == 0 || iVar18 < iVar10) {
                  local_188._16_4_ = iVar18;
                  std::__cxx11::string::_M_replace
                            ((ulong)local_1e0,0,(char *)local_1e0._8_8_,0x198db0);
                  std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)local_190,0x198db0);
                  local_188._16_4_ = local_188._16_4_ + 2;
                  goto LAB_0015c4cf;
                }
                std::__cxx11::to_string((string *)local_210,iVar17);
                std::__cxx11::string::_M_append(local_188 + 0x18,local_210._0_8_);
                if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                  operator_delete((void *)local_210._0_8_);
                }
                std::__cxx11::to_string((string *)local_210,iVar17);
                std::__cxx11::string::_M_append(local_130,local_210._0_8_);
                if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                  operator_delete((void *)local_210._0_8_);
                }
                std::__cxx11::string::substr((ulong)local_210,(ulong)psVar16);
                std::__cxx11::string::_M_append(local_188 + 0x18,local_210._0_8_);
                if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                  operator_delete((void *)local_210._0_8_);
                }
                std::__cxx11::string::substr((ulong)local_210,(ulong)psVar19);
                std::__cxx11::string::_M_append(local_130,local_210._0_8_);
              }
              if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                operator_delete((void *)local_210._0_8_);
              }
              break;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
          goto LAB_0015cf68;
        }
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_210,local_1e0._0_8_,(char *)(local_1e0._8_8_ + local_1e0._0_8_));
        std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
        std::__cxx11::string::operator=((string *)local_1e0,(string *)local_210);
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
        if ((string *)psVar16->_M_string_length <= local_1f0) goto LAB_0015cf80;
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_210,local_198._M_h,
                   (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)((long)local_190 + (long)local_198._M_h));
        std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
        std::__cxx11::string::operator=((string *)&local_198,(string *)local_210);
        psVar19 = local_1e8;
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
          psVar19 = local_1e8;
        }
LAB_0015c4cf:
        psVar11 = (string *)((long)&(local_1f0->_M_dataplus)._M_p + 1);
        if ((string *)psVar16->_M_string_length <= psVar11) break;
      }
    }
    if ((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)local_198._M_h !=
        (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)local_188) {
      operator_delete(local_198._M_h);
    }
    if ((hmm *)local_1e0._0_8_ != (hmm *)(local_1e0 + 0x10)) {
LAB_0015c6e0:
      operator_delete((void *)local_1e0._0_8_);
    }
  }
  else if (iVar10 == 0) {
    std::__cxx11::string::_M_assign((string *)(local_188 + 0x18));
    std::__cxx11::string::_M_assign((string *)local_130);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"0","");
    local_198._M_h = (__hashtable_alloc *)local_188;
    local_f0 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
    if (local_1f0->_M_string_length != 0) {
      uVar12 = 0;
      local_1e8 = (string *)((ulong)local_1e8 & 0xffffffff00000000);
      local_188._16_8_ = qual2;
      do {
        _Var15._M_h = local_198._M_h;
        uVar2 = local_1e0._0_8_;
        if (qual2->_M_string_length <= uVar12) break;
        cVar1 = (local_1f0->_M_dataplus)._M_p[uVar12];
        if ((cVar1 == 'O') || (cVar1 == 'C')) {
          if (((__buckets_ptr)local_1e0._8_8_ != local_190) ||
             (((__buckets_ptr)local_1e0._8_8_ != (__buckets_ptr)0x0 &&
              (iVar10 = bcmp((void *)local_1e0._0_8_,local_198._M_h,local_1e0._8_8_), iVar10 != 0)))
             ) goto LAB_0015c50d;
          piVar7 = __errno_location();
          auStack_1b0._8_4_ = *piVar7;
          *piVar7 = 0;
          lVar6 = strtol((char *)uVar2,(char **)local_210,10);
          qual2 = (string *)local_188._16_8_;
          if (local_210._0_8_ == uVar2) goto LAB_0015cf74;
          if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0015cf68;
          if (*piVar7 == 0) {
            *piVar7 = auStack_1b0._8_4_;
          }
          iVar10 = (int)local_1e8 + (int)lVar6;
          iVar17 = iVar10 - iVar18;
          if (iVar17 == 0) {
            std::__cxx11::string::substr((ulong)local_210,(ulong)local_1f0);
            std::__cxx11::string::_M_append((char *)&local_150,local_210._0_8_);
            if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
              operator_delete((void *)local_210._0_8_);
            }
            std::__cxx11::string::substr((ulong)local_210,(ulong)qual2);
            std::__cxx11::string::_M_append((char *)&local_110,local_210._0_8_);
            if ((hmm *)local_210._0_8_ == (hmm *)(local_210 + 0x10)) break;
          }
          else {
            if (iVar17 == 0 || iVar10 < iVar18) {
              local_1e8._0_4_ = iVar10;
              std::__cxx11::string::_M_replace((ulong)local_1e0,0,(char *)local_1e0._8_8_,0x198db0);
              std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)local_190,0x198db0);
              local_1e8 = (string *)CONCAT44(local_1e8._4_4_,(int)local_1e8 + 2);
              goto LAB_0015c20f;
            }
            std::__cxx11::to_string((string *)local_210,iVar17);
            std::__cxx11::string::_M_append((char *)&local_150,local_210._0_8_);
            if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
              operator_delete((void *)local_210._0_8_);
            }
            std::__cxx11::to_string((string *)local_210,iVar17);
            std::__cxx11::string::_M_append((char *)&local_110,local_210._0_8_);
            if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
              operator_delete((void *)local_210._0_8_);
            }
            std::__cxx11::string::substr((ulong)local_210,(ulong)local_1f0);
            std::__cxx11::string::_M_append((char *)&local_150,local_210._0_8_);
            if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
              operator_delete((void *)local_210._0_8_);
            }
            std::__cxx11::string::substr((ulong)local_210,(ulong)qual2);
            std::__cxx11::string::_M_append((char *)&local_110,local_210._0_8_);
            if ((hmm *)local_210._0_8_ == (hmm *)(local_210 + 0x10)) break;
          }
          operator_delete((void *)local_210._0_8_);
          break;
        }
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_210,local_1e0._0_8_,(char *)(local_1e0._8_8_ + local_1e0._0_8_));
        std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
        std::__cxx11::string::operator=((string *)local_1e0,(string *)local_210);
        if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
          operator_delete((void *)local_210._0_8_);
        }
        if (local_1f0->_M_string_length <= uVar12) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
        }
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_210,local_198._M_h,
                   (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)((long)local_190 + (long)local_198._M_h));
        std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
        std::__cxx11::string::operator=((string *)&local_198,(string *)local_210);
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
LAB_0015c20f:
        uVar12 = uVar12 + 1;
      } while (uVar12 < local_1f0->_M_string_length);
    }
    if ((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)local_198._M_h !=
        (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)local_188) {
      operator_delete(local_198._M_h);
    }
    this = local_f0;
    if ((hmm *)local_1e0._0_8_ != (hmm *)(local_1e0 + 0x10)) goto LAB_0015c6e0;
  }
  if ((_Hash_node_base *)local_170._M_string_length == (_Hash_node_base *)0x0) {
    uVar14 = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0015c7ab;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0015c7ab;
        }
        if (uVar9 < 10000) goto LAB_0015c7ab;
        uVar12 = uVar12 / 10000;
        uVar5 = uVar14 + 4;
      } while (99999 < uVar9);
      uVar14 = uVar14 + 1;
    }
LAB_0015c7ab:
    phVar8 = (hmm *)(local_1e0 + 0x10);
    local_1e0._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1e0,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._0_8_,uVar14,__val);
    std::__cxx11::string::_M_append(local_188 + 0x18,local_1e0._0_8_);
    if ((hmm *)local_1e0._0_8_ != phVar8) {
      operator_delete((void *)local_1e0._0_8_);
    }
    uVar14 = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0015c84a;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0015c84a;
        }
        if (uVar9 < 10000) goto LAB_0015c84a;
        uVar12 = uVar12 / 10000;
        uVar5 = uVar14 + 4;
      } while (99999 < uVar9);
      uVar14 = uVar14 + 1;
    }
LAB_0015c84a:
    local_1e0._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1e0,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._0_8_,uVar14,__val);
    std::__cxx11::string::_M_append(local_130,local_1e0._0_8_);
LAB_0015c969:
    if ((hmm *)local_1e0._0_8_ != (hmm *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_);
    }
  }
  else if ((_Hash_node_base *)local_150._M_string_length == (_Hash_node_base *)0x0) {
    uVar14 = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0015c890;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0015c890;
        }
        if (uVar9 < 10000) goto LAB_0015c890;
        uVar12 = uVar12 / 10000;
        uVar5 = uVar14 + 4;
      } while (99999 < uVar9);
      uVar14 = uVar14 + 1;
    }
LAB_0015c890:
    phVar8 = (hmm *)(local_1e0 + 0x10);
    local_1e0._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1e0,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._0_8_,uVar14,__val);
    std::__cxx11::string::_M_append((char *)&local_150,local_1e0._0_8_);
    if ((hmm *)local_1e0._0_8_ != phVar8) {
      operator_delete((void *)local_1e0._0_8_);
    }
    uVar14 = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0015c92f;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0015c92f;
        }
        if (uVar9 < 10000) goto LAB_0015c92f;
        uVar12 = uVar12 / 10000;
        uVar5 = uVar14 + 4;
      } while (99999 < uVar9);
      uVar14 = uVar14 + 1;
    }
LAB_0015c92f:
    local_1e0._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1e0,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._0_8_,uVar14,__val);
    std::__cxx11::string::_M_append((char *)&local_110,local_1e0._0_8_);
    goto LAB_0015c969;
  }
  sVar4 = local_150._M_string_length;
  sVar3 = local_170._M_string_length;
  if (local_170._M_string_length < local_150._M_string_length) {
    trimCodes((string *)(local_188 + 0x18),(string *)local_130,__val,(int *)(auStack_1b0 + 0x14),
              false);
  }
  else {
    trimCodes((string *)(local_188 + 0x18),(string *)local_130,__val,(int *)(auStack_1b0 + 0x14),
              local_150._M_string_length < local_170._M_string_length);
  }
  trimCodes(&local_150,&local_110,__val,(int *)(auStack_1b0 + 0x14),sVar3 < sVar4);
  iVar10 = 0;
  iVar18 = 0;
  if ((_Hash_node_base *)local_170._M_string_length != (_Hash_node_base *)0x0) {
    p_Var13 = (_Hash_node_base *)0x0;
    iVar17 = 0;
    do {
      iVar17 = iVar17 + (uint)(local_170._M_dataplus._M_p[(long)p_Var13] == 'O');
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
    } while ((_Hash_node_base *)local_170._M_string_length != p_Var13);
    p_Var13 = (_Hash_node_base *)0x0;
    iVar18 = 0;
    do {
      iVar18 = iVar18 + (uint)(local_170._M_dataplus._M_p[(long)p_Var13] == 'C');
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
    } while ((_Hash_node_base *)local_170._M_string_length != p_Var13);
    iVar18 = iVar18 + iVar17;
  }
  if ((_Hash_node_base *)local_150._M_string_length != (_Hash_node_base *)0x0) {
    p_Var13 = (_Hash_node_base *)0x0;
    iVar17 = 0;
    do {
      iVar17 = iVar17 + (uint)(*(char *)((long)&p_Var13->_M_nxt + (long)local_150._M_dataplus._M_p)
                              == 'O');
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
    } while ((_Hash_node_base *)local_150._M_string_length != p_Var13);
    p_Var13 = (_Hash_node_base *)0x0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (uint)(*(char *)((long)&p_Var13->_M_nxt + (long)local_150._M_dataplus._M_p)
                              == 'C');
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
    } while ((_Hash_node_base *)local_150._M_string_length != p_Var13);
    iVar10 = iVar10 + iVar17;
  }
  psVar19 = (string *)0xbff0000000000000;
  if (((local_170._M_string_length == local_150._M_string_length) && (numGCAllowedPos <= iVar18)) &&
     (iVar18 == iVar10)) {
    local_1e0._0_8_ = auStack_1b0;
    local_1e0._8_8_ = (__buckets_ptr)0x1;
    local_1e0._16_8_ = (_Hash_node_base *)0x0;
    p_Stack_1c8 = (_Hash_node_base *)0x0;
    local_1c0 = 1.0;
    sStack_1b8 = 0;
    auStack_1b0._0_8_ = (__node_base_ptr)0x0;
    if (isStrand1) {
      __ht = &(this->switchRateFS)._M_h;
    }
    else {
      __ht = &(this->switchRateRS)._M_h;
    }
    if (__ht != (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1e0) {
      std::
      _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_1e0,__ht);
    }
    phVar8 = (hmm *)operator_new(0x250);
    local_198._M_h = (__hashtable_alloc *)&local_68;
    local_68._M_buckets = (__buckets_ptr)0x0;
    local_68._M_bucket_count = local_1e0._8_8_;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = (size_type)p_Stack_1c8;
    local_68._M_rehash_policy._0_8_ = CONCAT44(uStack_1bc,local_1c0);
    local_68._M_rehash_policy._M_next_resize = sStack_1b8;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
              ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_198._M_h,
               (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_1e0,&local_198);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + (long)(_Hash_node_base **)local_170._M_string_length);
    local_88._0_8_ = (_Hash_node_base *)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_130._0_8_,
               (pointer)((long)(_Hash_node_base **)local_130._0_8_ + local_130._8_8_));
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + (long)(_Hash_node_base **)local_150._M_string_length);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_110._M_dataplus._M_p,
               local_110._M_string_length + local_110._M_dataplus._M_p);
    hmm::hmm(phVar8,(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)&local_68,&local_e8,(string *)local_88,&local_a8,&local_c8,numGCAllowedPos);
    local_210._0_8_ = phVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((_Hash_node_base *)local_88._0_8_ != (_Hash_node_base *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    dVar20 = hmm::calculateProbability(phVar8);
    if ((dVar20 != -1000.0) || (NAN(dVar20))) {
      local_1f0 = *(string **)
                   (&DAT_00198da0 +
                   (ulong)(this->nomeParam <= dVar20 && dVar20 != this->nomeParam) * 8);
    }
    else {
      local_1f0 = (string *)0xbff0000000000000;
    }
    hmm::~hmm(phVar8);
    operator_delete(phVar8);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_1e0);
    psVar19 = local_1f0;
  }
LAB_0015cd0a:
  local_1f0 = psVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((_Hash_node_base *)local_130._0_8_ != (_Hash_node_base *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return (double)local_1f0;
LAB_0015c50d:
  if ((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)_Var15._M_h !=
      (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)local_188) {
    operator_delete(_Var15._M_h);
  }
  if ((hmm *)local_1e0._0_8_ != (hmm *)(local_1e0 + 0x10)) {
    operator_delete((void *)local_1e0._0_8_);
  }
  psVar19 = (string *)0xbff0000000000000;
  goto LAB_0015cd0a;
LAB_0015cf68:
  std::__throw_out_of_range("stoi");
LAB_0015cf74:
  std::__throw_invalid_argument("stoi");
LAB_0015cf80:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

double NoMeEdgeCalculator::scoreSequences(std::string code1,std::string qual1, std::string code2,std::string qual2 , int start1, int end1, int start2, int end2 , bool isStrand1,bool isClique,int numGCAllowedPos, int ct) const{

    if((code1.find("C") != std::string::npos) || (code1.find("O") != std::string::npos)){
        if((code2.find("C") != std::string::npos) || (code2.find("O") != std::string::npos)){

        }else{
            return -1;
        }
    }else{
        return -1;
    }

    int overlap= 0;
    int s1=0;
    int s2=0;
    if(start1<start2){
        s2 = 0;
        s1 = start2-start1;
    }else if (start1>start2) {
        s1=0;
        s2=start1-start2;
    }else if (start1==start2) {
        s1=0;
        s2=0;
    }

    if(end1<end2){
        if(start1>start2){
            //          ----------------
           //     -------------------------------
            overlap=end1-start1+1;
        }else if (start1<start2) {
            //     --------------
            //        -----------------
            overlap=end1-start2+1;
        }else if (start1==start2) {
            //     -------------
            //     -----------------------
            overlap=end1-start1+1;
        }

    }else if (end1>end2) {
        if(start1>start2){
            //               ------------------
            //        -----------------
            overlap=end2-start1+1;
        }else if (start1<start2) {
            //     --------------------
            //        -----------
            overlap=end2-start2;
        }else if (start1==start2) {
            //        ------------------
            //        -----------
            overlap=end2-start1+1;
        }
    }else if (end1==end2) {
        if(start1<start2){
            //        ------------------
            //             -------------
            overlap=end1-start2+1;
        }else if (start1>start2) {
            //               -----------
            //        ------------------
            overlap=end1-start1+1;
        }else if (start1 == start2) {
            //        ------------------
            //        ------------------
            overlap=end1-start1+1 ;
        }
    }

    if(overlap<0){
        return -1;
    }


    string compareString1="";
    string compareQual1="";
    string compareString2="";
    string compareQual2="";
    int leftNonOverlapGCCount = -1;
    int rightNonOverlapGCCount = 0;

    if(s1==s2){
        leftNonOverlapGCCount = 0;
        compareString1 = code1;
        compareQual1 = qual1;
        compareString2 = code2;
        compareQual2 = qual2;
    }else if(s2==0){
        compareString2 = code2;
        compareQual2 = qual2;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code1.size() && i<qual1.size()){
            if(code1.at(i)=='O'||code1.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s1){
                    compareString1 += code1.substr(i);
                    compareQual1 += qual1.substr(i);
                    break;
                }else if(distance>s1){
                   compareString1 += std::to_string(distance - s1);
                   compareQual1 += std::to_string(distance - s1);
                   compareString1 += code1.substr(i);
                   compareQual1 += qual1.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code1.at(i);
                prevCountQual = prevCountQual + code1.at(i);
                i++;
            }
        }
    }else if(s1==0){
        compareString1 = code1;
        compareQual1 = qual1;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code2.size() && i<qual2.size()){
            if(code2.at(i)=='O'||code2.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s2){
                    compareString2 += code2.substr(i);
                    compareQual2 += qual2.substr(i);
                    break;
                }else if(distance>s2){
                   compareString2 += std::to_string(distance - s2);
                   compareQual2 += std::to_string(distance - s2);
                   compareString2 += code2.substr(i);
                   compareQual2 += qual2.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code2.at(i);
                prevCountQual = prevCountQual + code2.at(i);
                i++;
            }
        }
    }

    if(compareString1.size()==0){
        compareString1 += std::to_string(overlap);
        compareQual1 += std::to_string(overlap);
    }else if(compareString2.size()==0){
        compareString2 += std::to_string(overlap);
        compareQual2 += std::to_string(overlap);
    }
      if(compareString1.size()>compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,true);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }else if(compareString1.size()<compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,true);
    }else{
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }

    int numberOfPositions1= std::count(compareString1.begin(), compareString1.end(), 'O') + std::count(compareString1.begin(), compareString1.end(), 'C');
    int numberOfPositions2= std::count(compareString2.begin(), compareString2.end(), 'O') + std::count(compareString2.begin(), compareString2.end(), 'C');
    if(numberOfPositions1!=numberOfPositions2) return -1;

    if(numberOfPositions1<numGCAllowedPos){
        return -1;
    }


    if(compareString1.size()!=compareString2.size()){
        return -1;
    }


    //Needed for checking the non overlapping sections
//    if(nonOverlap>0){
//        if(leftNonOverlapGCCount>nonOverlap || rightNonOverlapGCCount>nonOverlap){
//            return -1;
//        }
//    }

    std::unordered_map<int, double> switchRateMap;
    if(isStrand1){
        switchRateMap = this->switchRateFS;
    }else{
        switchRateMap = this->switchRateRS;
    }
    std::auto_ptr<hmm> hmmProbability(new hmm(switchRateMap,compareString1,compareQual1,compareString2,compareQual2,numGCAllowedPos));

   double score = hmmProbability->calculateProbability();
   double prob = nomeParam;

   if(score == -1000){//meaning that there is something wrong with the codes
       return -1;
   }else{
//       //For ideal Graph
//       //specificPositionErrorMap[numberOfPositions1] = std::make_pair((specificPositionErrorMap[numberOfPositions1].first+1),(specificPositionErrorMap[numberOfPositions1].second));
//       return 1;
       //For normal edge Criterion
       if(score > prob){
           return 1;
       }else{
           return -1;
       }
   }
}